

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void generateSortTail(Parse *pParse,Select *p,SortCtx *pSort,int nColumn,SelectDest *pDest)

{
  byte bVar1;
  u8 uVar2;
  ushort uVar3;
  int p2;
  int p1;
  Vdbe *p_00;
  ExprList *pEVar4;
  ExprList *pEVar5;
  char *zP4;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int p3;
  int *piVar10;
  byte bVar11;
  int iVar12;
  uint p2_00;
  Op *pOVar13;
  long lVar14;
  int p2_01;
  anon_union_4_2_6146edf4_for_u *paVar15;
  int p2_02;
  int iVar16;
  ulong uVar17;
  int p1_00;
  int local_84;
  
  p_00 = pParse->pVdbe;
  p2 = pSort->labelDone;
  p2_01 = pParse->nLabel + -1;
  pParse->nLabel = p2_01;
  pEVar4 = pSort->pOrderBy;
  bVar1 = pDest->eDest;
  iVar9 = pDest->iSDParm;
  pEVar5 = p->pEList;
  if (pSort->labelBkOut != 0) {
    sqlite3VdbeAddOp3(p_00,0xc,pSort->regReturn,pSort->labelBkOut,0);
    sqlite3VdbeAddOp3(p_00,0xb,0,p2,0);
    sqlite3VdbeResolveLabel(p_00,pSort->labelBkOut);
  }
  p1 = pSort->iECursor;
  if ((bVar1 < 0xe) && ((0x2600U >> (bVar1 & 0x1f) & 1) != 0)) {
    p3 = pDest->iSdst;
    p2_02 = 0;
  }
  else {
    uVar2 = pParse->nTempReg;
    if (uVar2 == '\0') {
      p2_02 = pParse->nMem + 1;
      pParse->nMem = p2_02;
      if ((bVar1 & 0xfd) != 0xc) goto LAB_0017dce8;
LAB_0017dcce:
      p3 = pParse->nMem + 1;
      pParse->nMem = p3;
    }
    else {
      bVar11 = uVar2 - 1;
      pParse->nTempReg = bVar11;
      p2_02 = pParse->aTempReg[bVar11];
      if ((bVar1 & 0xfd) != 0xc) {
LAB_0017dce8:
        p3 = sqlite3GetTempRange(pParse,nColumn);
        goto LAB_0017d82e;
      }
      if (bVar11 == 0) goto LAB_0017dcce;
      pParse->nTempReg = uVar2 - 2;
      p3 = pParse->aTempReg[(byte)(uVar2 - 2)];
    }
    nColumn = 0;
  }
LAB_0017d82e:
  iVar7 = pEVar4->nExpr - pSort->nOBSat;
  if ((pSort->sortFlags & 1) == 0) {
    local_84 = sqlite3VdbeAddOp3(p_00,0x23,p1,p2,0);
    iVar16 = 1;
    p1_00 = p1;
    if (0 < p->iOffset) {
      sqlite3VdbeAddOp3(p_00,0x2f,p->iOffset,p2_01,1);
    }
  }
  else {
    p1_00 = pParse->nTab;
    iVar16 = pParse->nMem + 1;
    pParse->nMem = iVar16;
    pParse->nTab = p1_00 + 1;
    if (pSort->labelBkOut == 0) {
      iVar8 = 0;
    }
    else {
      iVar8 = sqlite3VdbeAddOp3(p_00,0x11,0,0,0);
    }
    sqlite3VdbeAddOp3(p_00,0x74,p1_00,iVar16,nColumn + iVar7 + 1);
    if (iVar8 != 0) {
      if (p_00->db->mallocFailed == '\0') {
        iVar12 = p_00->nOp + -1;
        if (-1 < iVar8) {
          iVar12 = iVar8;
        }
        pOVar13 = p_00->aOp + iVar12;
      }
      else {
        pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar13->p2 = p_00->nOp;
    }
    local_84 = sqlite3VdbeAddOp3(p_00,0x22,p1,p2,0);
    if (0 < p->iOffset) {
      sqlite3VdbeAddOp3(p_00,0x2f,p->iOffset,p2_01,1);
    }
    sqlite3VdbeAddOp3(p_00,0x7e,p1,iVar16,p1_00);
    iVar16 = 0;
  }
  iVar16 = iVar16 + iVar7;
  if (0 < nColumn) {
    iVar7 = iVar16 + -1;
    uVar17 = (ulong)(uint)nColumn;
    lVar14 = 0;
    do {
      iVar7 = iVar7 + (uint)(*(short *)((long)&pEVar5->a[0].u + lVar14) == 0);
      lVar14 = lVar14 + 0x20;
    } while (uVar17 << 5 != lVar14);
    if (0 < nColumn) {
      paVar15 = &pEVar5->a[uVar17 - 1].u;
      do {
        uVar3 = (paVar15->x).iOrderByCol;
        iVar8 = uVar3 - 1;
        if (uVar3 == 0) {
          iVar8 = iVar7;
        }
        iVar7 = iVar7 - (uint)(uVar3 == 0);
        sqlite3VdbeAddOp3(p_00,0x5a,p1_00,iVar8,p3 + -1 + (int)uVar17);
        paVar15 = paVar15 + -8;
        bVar6 = 1 < uVar17;
        uVar17 = uVar17 - 1;
      } while (bVar6);
    }
  }
  switch(bVar1) {
  case 9:
    iVar9 = pDest->iSdst;
    iVar7 = 0x51;
    p2_00 = nColumn;
    goto LAB_0017dbd7;
  case 10:
    break;
  case 0xb:
    zP4 = pDest->zAffSdst;
    iVar7 = sqlite3VdbeAddOp3(p_00,0x5c,p3,nColumn,p2_02);
    sqlite3VdbeChangeP4(p_00,iVar7,zP4,nColumn);
    iVar9 = sqlite3VdbeAddOp3(p_00,0x84,iVar9,p2_02,p3);
    if (p_00->db->mallocFailed == '\0') {
      pOVar13 = p_00->aOp;
      pOVar13[iVar9].p4type = -3;
      pOVar13[iVar9].p4.i = nColumn;
    }
    break;
  case 0xc:
  case 0xe:
    sqlite3VdbeAddOp3(p_00,0x5a,p1_00,iVar16,p3);
    sqlite3VdbeAddOp3(p_00,0x79,iVar9,p2_02,0);
    sqlite3VdbeAddOp3(p_00,0x7a,iVar9,p3,p2_02);
    if (0 < (long)p_00->nOp) {
      p_00->aOp[(long)p_00->nOp + -1].p5 = 8;
    }
    break;
  default:
    iVar9 = pDest->iSDParm;
    iVar7 = 0xe;
    p2_00 = 0;
LAB_0017dbd7:
    sqlite3VdbeAddOp3(p_00,iVar7,iVar9,p2_00,0);
  }
  if (p2_02 == 0) goto LAB_0017dc59;
  if ((bVar1 == 0xb) && (nColumn != 1)) {
    if (pParse->nRangeReg < nColumn) {
      pParse->nRangeReg = nColumn;
      piVar10 = &pParse->iRangeReg;
LAB_0017dc3b:
      *piVar10 = p3;
    }
  }
  else if (p3 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      piVar10 = pParse->aTempReg + bVar1;
      goto LAB_0017dc3b;
    }
  }
  bVar1 = pParse->nTempReg;
  if ((ulong)bVar1 < 8) {
    pParse->nTempReg = bVar1 + 1;
    pParse->aTempReg[bVar1] = p2_02;
  }
LAB_0017dc59:
  sqlite3VdbeResolveLabel(p_00,p2_01);
  sqlite3VdbeAddOp3(p_00,(uint)((pSort->sortFlags & 1) == 0) * 2 + 3,p1,local_84 + 1,0);
  if (pSort->regReturn != 0) {
    sqlite3VdbeAddOp3(p_00,0x42,pSort->regReturn,0,0);
  }
  sqlite3VdbeResolveLabel(p_00,p2);
  return;
}

Assistant:

static void generateSortTail(
  Parse *pParse,    /* Parsing context */
  Select *p,        /* The SELECT statement */
  SortCtx *pSort,   /* Information on the ORDER BY clause */
  int nColumn,      /* Number of columns of data */
  SelectDest *pDest /* Write the sorted results here */
){
  Vdbe *v = pParse->pVdbe;                     /* The prepared statement */
  int addrBreak = pSort->labelDone;            /* Jump here to exit loop */
  int addrContinue = sqlite3VdbeMakeLabel(pParse);/* Jump here for next cycle */
  int addr;                       /* Top of output loop. Jump for Next. */
  int addrOnce = 0;
  int iTab;
  ExprList *pOrderBy = pSort->pOrderBy;
  int eDest = pDest->eDest;
  int iParm = pDest->iSDParm;
  int regRow;
  int regRowid;
  int iCol;
  int nKey;                       /* Number of key columns in sorter record */
  int iSortTab;                   /* Sorter cursor to read from */
  int i;
  int bSeq;                       /* True if sorter record includes seq. no. */
  int nRefKey = 0;
  struct ExprList_item *aOutEx = p->pEList->a;

  assert( addrBreak<0 );
  if( pSort->labelBkOut ){
    sqlite3VdbeAddOp2(v, OP_Gosub, pSort->regReturn, pSort->labelBkOut);
    sqlite3VdbeGoto(v, addrBreak);
    sqlite3VdbeResolveLabel(v, pSort->labelBkOut);
  }

#ifdef SQLITE_ENABLE_SORTER_REFERENCES
  /* Open any cursors needed for sorter-reference expressions */
  for(i=0; i<pSort->nDefer; i++){
    Table *pTab = pSort->aDefer[i].pTab;
    int iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
    sqlite3OpenTable(pParse, pSort->aDefer[i].iCsr, iDb, pTab, OP_OpenRead);
    nRefKey = MAX(nRefKey, pSort->aDefer[i].nKey);
  }
#endif

  iTab = pSort->iECursor;
  if( eDest==SRT_Output || eDest==SRT_Coroutine || eDest==SRT_Mem ){
    regRowid = 0;
    regRow = pDest->iSdst;
  }else{
    regRowid = sqlite3GetTempReg(pParse);
    if( eDest==SRT_EphemTab || eDest==SRT_Table ){
      regRow = sqlite3GetTempReg(pParse);
      nColumn = 0;
    }else{
      regRow = sqlite3GetTempRange(pParse, nColumn);
    }
  }
  nKey = pOrderBy->nExpr - pSort->nOBSat;
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    int regSortOut = ++pParse->nMem;
    iSortTab = pParse->nTab++;
    if( pSort->labelBkOut ){
      addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
    }
    sqlite3VdbeAddOp3(v, OP_OpenPseudo, iSortTab, regSortOut, 
        nKey+1+nColumn+nRefKey);
    if( addrOnce ) sqlite3VdbeJumpHere(v, addrOnce);
    addr = 1 + sqlite3VdbeAddOp2(v, OP_SorterSort, iTab, addrBreak);
    VdbeCoverage(v);
    codeOffset(v, p->iOffset, addrContinue);
    sqlite3VdbeAddOp3(v, OP_SorterData, iTab, regSortOut, iSortTab);
    bSeq = 0;
  }else{
    addr = 1 + sqlite3VdbeAddOp2(v, OP_Sort, iTab, addrBreak); VdbeCoverage(v);
    codeOffset(v, p->iOffset, addrContinue);
    iSortTab = iTab;
    bSeq = 1;
  }
  for(i=0, iCol=nKey+bSeq-1; i<nColumn; i++){
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( aOutEx[i].bSorterRef ) continue;
#endif
    if( aOutEx[i].u.x.iOrderByCol==0 ) iCol++;
  }
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
  if( pSort->nDefer ){
    int iKey = iCol+1;
    int regKey = sqlite3GetTempRange(pParse, nRefKey);

    for(i=0; i<pSort->nDefer; i++){
      int iCsr = pSort->aDefer[i].iCsr;
      Table *pTab = pSort->aDefer[i].pTab;
      int nKey = pSort->aDefer[i].nKey;

      sqlite3VdbeAddOp1(v, OP_NullRow, iCsr);
      if( HasRowid(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Column, iSortTab, iKey++, regKey);
        sqlite3VdbeAddOp3(v, OP_SeekRowid, iCsr, 
            sqlite3VdbeCurrentAddr(v)+1, regKey);
      }else{
        int k;
        int iJmp;
        assert( sqlite3PrimaryKeyIndex(pTab)->nKeyCol==nKey );
        for(k=0; k<nKey; k++){
          sqlite3VdbeAddOp3(v, OP_Column, iSortTab, iKey++, regKey+k);
        }
        iJmp = sqlite3VdbeCurrentAddr(v);
        sqlite3VdbeAddOp4Int(v, OP_SeekGE, iCsr, iJmp+2, regKey, nKey);
        sqlite3VdbeAddOp4Int(v, OP_IdxLE, iCsr, iJmp+3, regKey, nKey);
        sqlite3VdbeAddOp1(v, OP_NullRow, iCsr);
      }
    }
    sqlite3ReleaseTempRange(pParse, regKey, nRefKey);
  }
#endif
  for(i=nColumn-1; i>=0; i--){
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( aOutEx[i].bSorterRef ){
      sqlite3ExprCode(pParse, aOutEx[i].pExpr, regRow+i);
    }else
#endif
    {
      int iRead;
      if( aOutEx[i].u.x.iOrderByCol ){
        iRead = aOutEx[i].u.x.iOrderByCol-1;
      }else{
        iRead = iCol--;
      }
      sqlite3VdbeAddOp3(v, OP_Column, iSortTab, iRead, regRow+i);
      VdbeComment((v, "%s", aOutEx[i].zName?aOutEx[i].zName : aOutEx[i].zSpan));
    }
  }
  switch( eDest ){
    case SRT_Table:
    case SRT_EphemTab: {
      sqlite3VdbeAddOp3(v, OP_Column, iSortTab, nKey+bSeq, regRow);
      sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iParm, regRow, regRowid);
      sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case SRT_Set: {
      assert( nColumn==sqlite3Strlen30(pDest->zAffSdst) );
      sqlite3VdbeAddOp4(v, OP_MakeRecord, regRow, nColumn, regRowid,
                        pDest->zAffSdst, nColumn);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, regRowid, regRow, nColumn);
      break;
    }
    case SRT_Mem: {
      /* The LIMIT clause will terminate the loop for us */
      break;
    }
#endif
    default: {
      assert( eDest==SRT_Output || eDest==SRT_Coroutine ); 
      testcase( eDest==SRT_Output );
      testcase( eDest==SRT_Coroutine );
      if( eDest==SRT_Output ){
        sqlite3VdbeAddOp2(v, OP_ResultRow, pDest->iSdst, nColumn);
      }else{
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }
      break;
    }
  }
  if( regRowid ){
    if( eDest==SRT_Set ){
      sqlite3ReleaseTempRange(pParse, regRow, nColumn);
    }else{
      sqlite3ReleaseTempReg(pParse, regRow);
    }
    sqlite3ReleaseTempReg(pParse, regRowid);
  }
  /* The bottom of the loop
  */
  sqlite3VdbeResolveLabel(v, addrContinue);
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    sqlite3VdbeAddOp2(v, OP_SorterNext, iTab, addr); VdbeCoverage(v);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, iTab, addr); VdbeCoverage(v);
  }
  if( pSort->regReturn ) sqlite3VdbeAddOp1(v, OP_Return, pSort->regReturn);
  sqlite3VdbeResolveLabel(v, addrBreak);
}